

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_iceilf(float x)

{
  int local_20;
  float r;
  int t;
  int i;
  float x_local;
  
  if (x < 0.0) {
    local_20 = (int)x;
    if (0.0 < x - (float)local_20) {
      local_20 = local_20 + 1;
    }
    i = local_20;
  }
  else {
    i = (int)x;
  }
  return i;
}

Assistant:

NK_INTERN int
nk_iceilf(float x)
{
    if (x >= 0) {
        int i = (int)x;
        return i;
    } else {
        int t = (int)x;
        float r = x - (float)t;
        return (r > 0.0f) ? t+1: t;
    }
}